

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uchar * jpgd::decompress_jpeg_image_from_file
                  (char *pSrc_filename,int *width,int *height,int *actual_comps,int req_comps,
                  uint32_t flags)

{
  uint uVar1;
  int __oflag;
  char *in_RDI;
  jpeg_decoder_file_stream file_stream;
  uint32_t in_stack_00003518;
  int in_stack_0000351c;
  int *in_stack_00003520;
  int *in_stack_00003528;
  int *in_stack_00003530;
  jpeg_decoder_stream *in_stack_00003538;
  jpeg_decoder_file_stream *in_stack_ffffffffffffff90;
  jpeg_decoder_file_stream local_48 [2];
  char *local_10;
  jpeg_decoder_file_stream *local_8;
  
  local_10 = in_RDI;
  jpeg_decoder_file_stream::jpeg_decoder_file_stream(in_stack_ffffffffffffff90);
  uVar1 = jpeg_decoder_file_stream::open(local_48,local_10,__oflag);
  if ((uVar1 & 1) == 0) {
    local_8 = (jpeg_decoder_file_stream *)0x0;
  }
  else {
    in_stack_ffffffffffffff90 =
         (jpeg_decoder_file_stream *)
         decompress_jpeg_image_from_stream
                   (in_stack_00003538,in_stack_00003530,in_stack_00003528,in_stack_00003520,
                    in_stack_0000351c,in_stack_00003518);
    local_8 = in_stack_ffffffffffffff90;
  }
  jpeg_decoder_file_stream::~jpeg_decoder_file_stream(in_stack_ffffffffffffff90);
  return (uchar *)local_8;
}

Assistant:

unsigned char* decompress_jpeg_image_from_file(const char* pSrc_filename, int* width, int* height, int* actual_comps, int req_comps, uint32_t flags)
	{
		jpgd::jpeg_decoder_file_stream file_stream;
		if (!file_stream.open(pSrc_filename))
			return nullptr;
		return decompress_jpeg_image_from_stream(&file_stream, width, height, actual_comps, req_comps, flags);
	}